

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_string * mg_string_make2(uint32_t len,char *data)

{
  void *in_RSI;
  uint in_EDI;
  mg_string *str;
  mg_allocator *in_stack_ffffffffffffffe0;
  mg_string *local_8;
  
  local_8 = mg_string_alloc((uint32_t)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe0);
  if (local_8 == (mg_string *)0x0) {
    local_8 = (mg_string *)0x0;
  }
  else {
    local_8->size = in_EDI;
    memcpy(local_8->data,in_RSI,(ulong)in_EDI);
  }
  return local_8;
}

Assistant:

mg_string *mg_string_make2(uint32_t len, const char *data) {
  mg_string *str = mg_string_alloc(len, &mg_system_allocator);
  if (!str) {
    return NULL;
  }
  str->size = len;
  memcpy(str->data, data, len);
  return str;
}